

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O2

Own<capnp::_::CapTableBuilder,_std::nullptr_t> __thiscall
capnp::MessageBuilder::releaseBuiltinCapTable(MessageBuilder *this)

{
  Own<capnp::_::CapTableBuilder,_std::nullptr_t> OVar1;
  
  OVar1 = capnp::_::BuilderArena::releaseLocalCapTable((BuilderArena *)this);
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<_::CapTableBuilder> MessageBuilder::releaseBuiltinCapTable() {
  return arena()->releaseLocalCapTable();
}